

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O1

void __thiscall
Imf_3_4::TypedAttribute<Imath_3_2::Matrix33<float>_>::TypedAttribute
          (TypedAttribute<Imath_3_2::Matrix33<float>_> *this,Matrix33<float> *value)

{
  Attribute::Attribute(&this->super_Attribute);
  (this->super_Attribute)._vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e5840;
  (this->_value).x[0][0] = value->x[0][0];
  (this->_value).x[0][1] = value->x[0][1];
  (this->_value).x[0][2] = value->x[0][2];
  (this->_value).x[1][0] = value->x[1][0];
  (this->_value).x[1][1] = value->x[1][1];
  (this->_value).x[1][2] = value->x[1][2];
  (this->_value).x[2][0] = value->x[2][0];
  (this->_value).x[2][1] = value->x[2][1];
  (this->_value).x[2][2] = value->x[2][2];
  return;
}

Assistant:

TypedAttribute<T>::TypedAttribute (const T& value)
    : Attribute (), _value (value)
{
    // empty
}